

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtData.h
# Opt level: O2

void __thiscall ProtData::ProtData(ProtData *this,char *filename,bool append_decoy)

{
  this->database_name_ = filename;
  this->append_decoy_ = append_decoy;
  (this->target_data_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->target_data_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->target_data_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->decoy_data_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->decoy_data_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->decoy_data_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->proteins_).super__Vector_base<PPData::Protein,_std::allocator<PPData::Protein>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->proteins_).super__Vector_base<PPData::Protein,_std::allocator<PPData::Protein>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->proteins_).super__Vector_base<PPData::Protein,_std::allocator<PPData::Protein>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ReadTargetData(this,filename);
  BuildTargetProteins(this);
  if (append_decoy) {
    BuildDecoy(this);
  }
  return;
}

Assistant:

ProtData(const char* filename, bool append_decoy) 
            : database_name_(filename), append_decoy_(append_decoy) {
        ReadTargetData(filename);  // read refined fasta into target_data_
        BuildTargetProteins();  // build target proteins into proteins_
        if (append_decoy) {  // build decoy_data_ and append decoys into proteins_
            BuildDecoy();
        }
    }